

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

char * cmsys::reg(int paren,int *flagp)

{
  uint uVar1;
  ushort uVar2;
  char *val;
  ulong uVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  int flags;
  uint local_2c;
  
  *flagp = 1;
  pcVar4 = regcode;
  if (paren == 0) {
    val = regbranch((int *)&local_2c);
    cVar5 = '\0';
    if (val == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    if (9 < regnpar) {
      pcVar4 = "RegularExpression::compile(): Too many parentheses.";
      goto LAB_0043bb3a;
    }
    cVar5 = (char)regnpar;
    if (regcode == &regdummy) {
      regsize = regsize + 3;
      regnpar = regnpar + 1;
    }
    else {
      regnpar = regnpar + 1;
      *regcode = cVar5 + '\x14';
      regcode[1] = '\0';
      regcode[2] = '\0';
      regcode = regcode + 3;
    }
    val = regbranch((int *)&local_2c);
    if (val == (char *)0x0) {
      return (char *)0x0;
    }
    cVar5 = cVar5 + '\x1e';
    if (pcVar4 != (char *)0x0) {
      regtail(pcVar4,val);
      val = pcVar4;
    }
  }
  uVar1 = *flagp & 0xfffffffe;
  if ((local_2c & 1) != 0) {
    uVar1 = *flagp;
  }
  *flagp = local_2c & 4 | uVar1;
  if (*regparse == '|') {
    do {
      regparse = regparse + 1;
      pcVar4 = regbranch((int *)&local_2c);
      if (pcVar4 == (char *)0x0) {
        return (char *)0x0;
      }
      regtail(val,pcVar4);
      uVar1 = *flagp & 0xfffffffe;
      if ((local_2c & 1) != 0) {
        uVar1 = *flagp;
      }
      *flagp = local_2c & 4 | uVar1;
    } while (*regparse == '|');
  }
  pcVar4 = regcode;
  if (regcode == &regdummy) {
    regsize = regsize + 3;
  }
  else {
    *regcode = cVar5;
    regcode[1] = '\0';
    regcode[2] = '\0';
    regcode = regcode + 3;
  }
  regtail(val,pcVar4);
  pcVar6 = val;
  if (val != &regdummy) {
    do {
      if (*pcVar6 == '\x06') {
        regtail(pcVar6 + 3,pcVar4);
      }
      uVar2 = *(ushort *)(pcVar6 + 1) << 8 | *(ushort *)(pcVar6 + 1) >> 8;
      if (uVar2 == 0) break;
      uVar3 = -(ulong)uVar2;
      if (*pcVar6 != '\a') {
        uVar3 = (ulong)uVar2;
      }
      pcVar6 = pcVar6 + uVar3;
    } while (pcVar6 != &regdummy);
  }
  if (paren == 0) {
    if (*regparse == '\0') {
      return val;
    }
    if (*regparse != ')') {
      pcVar4 = "RegularExpression::compile(): Internal error.";
      goto LAB_0043bb3a;
    }
  }
  else {
    pcVar4 = regparse + 1;
    cVar5 = *regparse;
    regparse = pcVar4;
    if (cVar5 == ')') {
      return val;
    }
  }
  pcVar4 = "RegularExpression::compile(): Unmatched parentheses.";
LAB_0043bb3a:
  puts(pcVar4);
  return (char *)0x0;
}

Assistant:

static char* reg (int paren, int *flagp) {
    char* ret;
    char* br;
    char* ender;
    int   parno =0;
    int   flags;

    *flagp = HASWIDTH;          // Tentatively.

    // Make an OPEN node, if parenthesized.
    if (paren) {
        if (regnpar >=  RegularExpression::NSUBEXP) {
          //RAISE Error, SYM(RegularExpression), SYM(Too_Many_Parens),
          printf ("RegularExpression::compile(): Too many parentheses.\n");
          return 0;
        }
        parno = regnpar;
        regnpar++;
        ret = regnode(static_cast<char>(OPEN + parno));
    }
    else
        ret = 0;

    // Pick up the branches, linking them together.
    br = regbranch(&flags);
    if (br == 0)
        return (0);
    if (ret != 0)
        regtail(ret, br);       // OPEN -> first.
    else
        ret = br;
    if (!(flags & HASWIDTH))
        *flagp &= ~HASWIDTH;
    *flagp |= flags & SPSTART;
    while (*regparse == '|') {
        regparse++;
        br = regbranch(&flags);
        if (br == 0)
            return (0);
        regtail(ret, br);       // BRANCH -> BRANCH.
        if (!(flags & HASWIDTH))
            *flagp &= ~HASWIDTH;
        *flagp |= flags & SPSTART;
      }

    // Make a closing node, and hook it on the end.
    ender = regnode(static_cast<char>((paren) ? CLOSE + parno : END));
    regtail(ret, ender);

    // Hook the tails of the branches to the closing node.
    for (br = ret; br != 0; br = regnext(br))
        regoptail(br, ender);

    // Check for proper termination.
    if (paren && *regparse++ != ')') {
        //RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
        printf ("RegularExpression::compile(): Unmatched parentheses.\n");
        return 0;
    }
    else if (!paren && *regparse != '\0') {
        if (*regparse == ')') {
            //RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
            printf ("RegularExpression::compile(): Unmatched parentheses.\n");
            return 0;
        }
        else {
            //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
            printf ("RegularExpression::compile(): Internal error.\n");
            return 0;
        }
        // NOTREACHED
    }
    return (ret);
}